

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetInput.cpp
# Opt level: O3

void getCacheLineSize(void)

{
  ulong uVar1;
  
  do {
    puts("\nInput the number of the cacheline size(Unit:Byte)");
    puts("\n\t(for example:1,2,4,8,16,32,64...2^18)");
    std::istream::_M_extract<unsigned_long>((ulong *)&std::cin);
    if ((*(byte *)((long)&std::cerr + *(long *)(std::cin + -0x18)) & 5) != 0) {
      std::ios::clear((int)*(long *)(std::cin + -0x18) + 0x2070d0);
      std::istream::sync();
    }
  } while ((0x3fffe < i_cache_line_size - 1) ||
          (uVar1 = i_cache_line_size - (i_cache_line_size >> 1 & 0x5555555555555555),
          uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333),
          1 < (byte)(((uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)));
  return;
}

Assistant:

void getCacheLineSize()
{
	puts("\nInput the number of the cacheline size(Unit:Byte)");
	puts("\n\t(for example:1,2,4,8,16,32,64...2^18)");
	cin >> i_cache_line_size;
	if (cin.fail())
	{
		cin.clear();
		cin.sync();
	}
	if (i_cache_line_size < 1 || i_cache_line_size >= 262144
			|| (i_cache_line_size & (~i_cache_line_size + 1))
					!= i_cache_line_size)
	{
		getCacheLineSize();
	}
}